

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O0

void __thiscall Arena_Big_Test::~Arena_Big_Test(Arena_Big_Test *this)

{
  Arena_Big_Test *this_local;
  
  ~Arena_Big_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Arena, Big) {
  memt::Arena arena;
  void* a = arena.alloc(5);
  arena.freeTop(arena.alloc(1024 * 1024));
  arena.freeTop(arena.alloc(1024 * 1024));
  ASSERT_FALSE(arena.isEmpty());
  arena.freeTop(a);
  ASSERT_TRUE(arena.isEmpty());
}